

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

string * __thiscall
czh::utils::to_czhstr<std::__cxx11::string>
          (string *__return_storage_ptr__,utils *this,string *val,Color color)

{
  long lVar1;
  long lVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char __c;
  long lVar6;
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  lVar1 = *(long *)(this + 8);
  local_78 = __return_storage_ptr__;
  if (lVar1 != 0) {
    lVar2 = *(long *)this;
    lVar6 = 0;
    do {
      __c = *(char *)(lVar2 + lVar6);
      switch(__c) {
      case '\b':
        __c = 'b';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_98,'\\');
        break;
      case '\t':
        __c = 't';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_98,'\\');
        break;
      case '\n':
        __c = 'n';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_98,'\\');
        break;
      case '\v':
        break;
      case '\f':
        __c = 'f';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_98,'\\');
        break;
      case '\r':
        __c = 'r';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_98,'\\');
        break;
      default:
        if (__c == '\\') {
          __c = '\\';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&local_98,'\\');
        }
        else if (__c == '\"') {
          __c = '\"';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&local_98,'\\');
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_98,__c);
      lVar6 = lVar6 + 1;
    } while (lVar1 != lVar6);
  }
  std::operator+(&local_50,"\"",&local_98);
  pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_50,"\"");
  psVar3 = local_78;
  local_70._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
  paVar5 = &pbVar4->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == paVar5) {
    local_70.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_70._M_string_length = pbVar4->_M_string_length;
  (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar4->_M_string_length = 0;
  (pbVar4->field_2)._M_local_buf[0] = '\0';
  colorify(local_78,&local_70,(Color)val,STR);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return psVar3;
}

Assistant:

std::string to_czhstr(const std::string &val, Color color)
  {
    std::string ret;
    for (auto &r: val)
    {
      switch (r)
      {
        case '\"':
          ret += '\\';
          ret += '\"';
          break;
        case '\\':
          ret += '\\';
          ret += '\\';
          break;
        case '\b':
          ret += '\\';
          ret += 'b';
          break;
        case '\f':
          ret += '\\';
          ret += 'f';
          break;
        case '\n':
          ret += '\\';
          ret += 'n';
          break;
        case '\r':
          ret += '\\';
          ret += 'r';
          break;
        case '\t':
          ret += '\\';
          ret += 't';
          break;
        default:
          ret += r;
          break;
      }
    }
    return colorify(("\"" + ret + "\""), color, ColorType::STR);
  }